

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

char * dfdToStringVersionNumber(khr_df_versionnumber_e value)

{
  khr_df_versionnumber_e value_local;
  char *local_8;
  
  if (value == KHR_DF_VERSIONNUMBER_1_0) {
    local_8 = "KHR_DF_VERSIONNUMBER_1_1";
  }
  else if (value == KHR_DF_VERSIONNUMBER_1_2) {
    local_8 = "KHR_DF_VERSIONNUMBER_1_2";
  }
  else if (value == KHR_DF_VERSIONNUMBER_1_3) {
    local_8 = "KHR_DF_VERSIONNUMBER_1_3";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* dfdToStringVersionNumber(khr_df_versionnumber_e value) {
    switch (value) {
    case KHR_DF_VERSIONNUMBER_1_1:
    // case KHR_DF_VERSIONNUMBER_1_0: // Fallthrough, Matching values
        return "KHR_DF_VERSIONNUMBER_1_1";
    case KHR_DF_VERSIONNUMBER_1_2:
        return "KHR_DF_VERSIONNUMBER_1_2";
    case KHR_DF_VERSIONNUMBER_1_3:
        return "KHR_DF_VERSIONNUMBER_1_3";

    // case KHR_DF_VERSIONNUMBER_LATEST: // Fallthrough, Matching values
    case KHR_DF_VERSIONNUMBER_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}